

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void sphere_of_plasma_end(CHAR_DATA *ch,AFFECT_DATA *paf)

{
  long in_RSI;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff88;
  CHAR_DATA *in_stack_ffffffffffffff90;
  CHAR_DATA *in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa2;
  undefined2 in_stack_ffffffffffffffa4;
  undefined2 in_stack_ffffffffffffffa6;
  
  if (*(int *)(in_RSI + 0x38) == 7) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffffa6,
                                  CONCAT24(in_stack_ffffffffffffffa4,
                                           CONCAT22(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0))),
                 in_stack_ffffffffffffff98);
  }
  else {
    act((char *)CONCAT26(in_stack_ffffffffffffffa6,
                         CONCAT24(in_stack_ffffffffffffffa4,
                                  CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))),
        in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
    init_affect((AFFECT_DATA *)0x6ea675);
    affect_to_char(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void sphere_of_plasma_end(CHAR_DATA *ch, AFFECT_DATA *paf)
{
	AFFECT_DATA af;

	if (paf->aftype == AFT_TIMER)
	{
		send_to_char("You feel ready to create another sphere of plasma.\n\r", ch);
		return;
	}

	act("The sphere of plasma encasing you dissipates.", ch, nullptr, nullptr, TO_CHAR);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.type = gsn_sphere_of_plasma;
	af.level = ch->level;
	af.location = 0;
	af.modifier = 0;
	af.duration = ch->level / 5;
	affect_to_char(ch, &af);
}